

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesMemoryGetState(zes_mem_handle_t hMemory,zes_mem_state_t *pState)

{
  zes_pfnMemoryGetState_t pfnGetState;
  dditable_t *dditable;
  ze_result_t result;
  zes_mem_state_t *pState_local;
  zes_mem_handle_t hMemory_local;
  
  if (*(code **)(*(long *)(hMemory + 8) + 0xbc8) == (code *)0x0) {
    hMemory_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hMemory_local._4_4_ =
         (**(code **)(*(long *)(hMemory + 8) + 0xbc8))(*(undefined8 *)hMemory,pState);
  }
  return hMemory_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesMemoryGetState(
        zes_mem_handle_t hMemory,                       ///< [in] Handle for the component.
        zes_mem_state_t* pState                         ///< [in,out] Will contain the current health and allocated memory.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_mem_object_t*>( hMemory )->dditable;
        auto pfnGetState = dditable->zes.Memory.pfnGetState;
        if( nullptr == pfnGetState )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMemory = reinterpret_cast<zes_mem_object_t*>( hMemory )->handle;

        // forward to device-driver
        result = pfnGetState( hMemory, pState );

        return result;
    }